

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O0

void jsoncons::
     encode_traits<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,char,void>
     ::encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *val,basic_json_visitor<char> *encoder,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,
               error_code *ec)

{
  bool bVar1;
  error_code *ec_00;
  reference this;
  error_code *in_RCX;
  basic_json_visitor<char> *in_RSI;
  undefined1 auVar2 [16];
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_ffffffffffffff58;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
  *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  basic_json_visitor<char> *in_stack_ffffffffffffff70;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  *this_00;
  ser_context in_stack_ffffffffffffff98;
  ser_context context;
  _Self local_48;
  _Self local_40 [3];
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_28;
  basic_json_visitor<char> *local_10;
  
  local_28.int64_.val_ = (int64_t)in_RCX;
  local_10 = in_RSI;
  ec_00 = (error_code *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)0x2706f1);
  local_28._0_8_ = 0;
  this_00 = &local_28;
  ser_context::ser_context((ser_context *)&this_00->common_);
  basic_json_visitor<char>::begin_object
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (semantic_tag)((ulong)in_stack_ffffffffffffff60 >> 0x38),
             (ser_context *)in_stack_ffffffffffffff58,(error_code *)0x270732);
  ser_context::~ser_context((ser_context *)&local_28.common_);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_28.long_str_.ptr_);
  if (!bVar1) {
    local_40[0]._M_node =
         (_Base_ptr)
         std::
         begin<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
                   (in_stack_ffffffffffffff58);
    while( true ) {
      local_48._M_node =
           (_Base_ptr)
           std::
           end<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
                     (in_stack_ffffffffffffff58);
      bVar1 = std::operator!=(local_40,&local_48);
      if (!bVar1) break;
      this = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                          *)0x2707d0);
      auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
      context._vptr_ser_context = (_func_int **)0x0;
      ser_context::ser_context((ser_context *)&stack0xffffffffffffffa0);
      basic_json_visitor<char>::key
                (auVar2._8_8_,auVar2._0_8_,(ser_context *)context._vptr_ser_context);
      ser_context::~ser_context((ser_context *)&stack0xffffffffffffffa0);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                   *)0x270824);
      encode_traits<double,char,void>::
      encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                ((double *)context._vptr_ser_context,
                 (basic_json_visitor<char> *)in_stack_ffffffffffffff98._vptr_ser_context,
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 &this_00->common_,ec_00);
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_28.long_str_.ptr_);
      if (bVar1) {
        return;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
      ::operator++(in_stack_ffffffffffffff60);
    }
    ser_context::ser_context((ser_context *)&stack0xffffffffffffff98);
    basic_json_visitor<char>::end_object
              (local_10,(ser_context *)in_stack_ffffffffffffff58,(error_code *)0x2708ce);
    ser_context::~ser_context((ser_context *)&stack0xffffffffffffff98);
    std::error_code::operator_cast_to_bool((error_code *)local_28.long_str_.ptr_);
  }
  return;
}

Assistant:

static void encode(const T& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_object(val.size(), semantic_tag::none, ser_context(), ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            for (auto it = std::begin(val); it != std::end(val); ++it)
            {
                encoder.key((*it).first);
                encode_traits<mapped_type,CharT>::encode((*it).second, encoder, proto, ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
            }
            encoder.end_object(ser_context(), ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
        }